

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v5::internal::
     handle_cstring_type_spec<char,fmt::v5::internal::cstring_type_checker<fmt::v5::internal::error_handler>>
               (char spec,cstring_type_checker<fmt::v5::internal::error_handler> *handler)

{
  cstring_type_checker<fmt::v5::internal::error_handler> *handler_local;
  char spec_local;
  
  if ((spec == '\0') || (spec == 's')) {
    cstring_type_checker<fmt::v5::internal::error_handler>::on_string(handler);
  }
  else if (spec == 'p') {
    cstring_type_checker<fmt::v5::internal::error_handler>::on_pointer(handler);
  }
  else {
    error_handler::on_error((error_handler *)handler,"invalid type specifier");
  }
  return;
}

Assistant:

FMT_CONSTEXPR void handle_cstring_type_spec(Char spec, Handler &&handler) {
  if (spec == 0 || spec == 's')
    handler.on_string();
  else if (spec == 'p')
    handler.on_pointer();
  else
    handler.on_error("invalid type specifier");
}